

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_FieldNumberError_Test::
~ParserValidationErrorTest_FieldNumberError_Test
          (ParserValidationErrorTest_FieldNumberError_Test *this)

{
  ParserValidationErrorTest_FieldNumberError_Test *this_local;
  
  ~ParserValidationErrorTest_FieldNumberError_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, FieldNumberError) {
  ExpectHasValidationErrors(
      "message Foo {\n"
      "  optional int32 bar = 0;\n"
      "}\n",
      "1:23: Field numbers must be positive integers.\n"
      "1:23: Suggested field numbers for Foo: 1\n");
}